

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuLayoutItem>::emplace<QDBusMenuLayoutItem_const&>
          (QMovableArrayOps<QDBusMenuLayoutItem> *this,qsizetype i,QDBusMenuLayoutItem *args)

{
  QDBusMenuLayoutItem **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_80;
  QDBusMenuLayoutItem tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
           super_QArrayDataPointer<QDBusMenuLayoutItem>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
        super_QArrayDataPointer<QDBusMenuLayoutItem>.size == i) {
      qVar5 = QArrayDataPointer<QDBusMenuLayoutItem>::freeSpaceAtEnd
                        ((QArrayDataPointer<QDBusMenuLayoutItem> *)this);
      if (qVar5 == 0) goto LAB_005938c9;
      QDBusMenuLayoutItem::QDBusMenuLayoutItem
                ((this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
                 super_QArrayDataPointer<QDBusMenuLayoutItem>.ptr +
                 (this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
                 super_QArrayDataPointer<QDBusMenuLayoutItem>.size,args);
LAB_005939c2:
      pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
                super_QArrayDataPointer<QDBusMenuLayoutItem>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00593981;
    }
LAB_005938c9:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QDBusMenuLayoutItem>::freeSpaceAtBegin
                        ((QArrayDataPointer<QDBusMenuLayoutItem> *)this);
      if (qVar5 != 0) {
        QDBusMenuLayoutItem::QDBusMenuLayoutItem
                  ((this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
                   super_QArrayDataPointer<QDBusMenuLayoutItem>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
                   super_QArrayDataPointer<QDBusMenuLayoutItem>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_005939c2;
      }
    }
  }
  tmp.m_children.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_children.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_children.d.ptr = (QDBusMenuLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
  tmp._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.m_properties.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
        )&DAT_aaaaaaaaaaaaaaaa;
  QDBusMenuLayoutItem::QDBusMenuLayoutItem(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
          super_QArrayDataPointer<QDBusMenuLayoutItem>.size != 0;
  QArrayDataPointer<QDBusMenuLayoutItem>::detachAndGrow
            ((QArrayDataPointer<QDBusMenuLayoutItem> *)this,(uint)(i == 0 && bVar6),1,
             (QDBusMenuLayoutItem **)0x0,(QArrayDataPointer<QDBusMenuLayoutItem> *)0x0);
  if (i == 0 && bVar6) {
    QDBusMenuLayoutItem::QDBusMenuLayoutItem
              ((this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
               super_QArrayDataPointer<QDBusMenuLayoutItem>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
               super_QArrayDataPointer<QDBusMenuLayoutItem>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
              super_QArrayDataPointer<QDBusMenuLayoutItem>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QDBusMenuLayoutItem> *)this,i,1);
    QDBusMenuLayoutItem::QDBusMenuLayoutItem(local_80.displaceFrom,&tmp);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QDBusMenuLayoutItem::~QDBusMenuLayoutItem(&tmp);
LAB_00593981:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }